

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
ConcreteMachine(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
               Target *target,ROMFetcher *rom_fetcher)

{
  PIC *pic;
  PCSpeaker *this_00;
  Video *card;
  Memory *pMVar1;
  _Base_ptr p_Var2;
  Video *pVVar3;
  RTC *pRVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  long lVar7;
  _Base_ptr p_Var8;
  undefined4 *puVar9;
  _Rb_tree_header *p_Var10;
  size_t sVar11;
  _Rb_tree_header *p_Var12;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  Request request;
  Request local_a8;
  Request local_80;
  Request local_58;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_005a6600;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00593df0;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_005983e0;
  p_Var12 = &roms._M_t._M_impl.super__Rb_tree_header;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var12->_M_header;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var12->_M_header;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005a6378;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005a6400;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005a6448;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a6460;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a6490;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005a64d0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005a64e8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005a6520;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_005a6538;
  pic = &this->pic_;
  (this->pic_).eoi_target_ = 0;
  (this->pic_).requests_ = '\0';
  (this->pic_).in_service_ = '\0';
  (this->pic_).single_pic_ = false;
  (this->pic_).four_byte_vectors_ = false;
  (this->pic_).level_triggered_ = false;
  (this->pic_).auto_eoi_ = false;
  (this->pic_).auto_eoi_ = false;
  (this->pic_).vector_base_ = '\0';
  (this->pic_).mask_ = '\0';
  (this->pic_).awaiting_eoi_ = false;
  (this->dma_).controller.next_access_low_ = true;
  (this->dma_).controller.enable_memory_to_memory_ = false;
  (this->dma_).controller.enable_channel0_address_hold_ = false;
  (this->dma_).controller.enable_controller_ = false;
  (this->dma_).controller.compressed_timing_ = false;
  (this->dma_).controller.rotating_priority_ = false;
  (this->dma_).controller.extended_write_selection_ = false;
  (this->dma_).controller.dreq_active_low_ = false;
  (this->dma_).controller.dack_sense_active_high_ = false;
  lVar7 = 0x135;
  do {
    *(undefined1 *)((long)this + lVar7 + -0x11) = 0;
    *(undefined4 *)((long)this + lVar7 + -0xd) = 0;
    *(undefined2 *)((long)this + lVar7 + -9) = 0;
    *(undefined4 *)((long)this + lVar7 + -5) = 0;
    *(undefined2 *)((long)this + lVar7 + -1) = 0;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x195);
  this_00 = &this->speaker_;
  PCSpeaker::PCSpeaker(this_00);
  card = &this->video_;
  MDA::CRTCOutputter::CRTCOutputter(&card->outputter_);
  (this->video_).crtc_.bus_handler_ = &card->outputter_;
  (this->video_).crtc_.bus_state_.field_count = 0;
  (this->video_).crtc_.bus_state_.display_enable = false;
  (this->video_).crtc_.bus_state_.hsync = false;
  (this->video_).crtc_.bus_state_.vsync = false;
  (this->video_).crtc_.bus_state_.cursor = false;
  (this->video_).crtc_.bus_state_.refresh_address = 0;
  (this->video_).crtc_.bus_state_.row_address = 0;
  (this->video_).crtc_.layout_.interlace_mode_ = Off;
  (this->video_).crtc_.line_address_ = 0;
  (this->video_).crtc_.end_of_line_address_ = 0;
  (this->video_).crtc_.status_ = '\0';
  (this->video_).crtc_.selected_register_ = 0;
  (this->video_).crtc_.character_counter_ = '\0';
  (this->video_).crtc_.line_counter_ = '\0';
  (this->video_).crtc_.character_is_visible_ = false;
  (this->video_).crtc_.line_is_visible_ = false;
  (this->video_).crtc_.hsync_counter_ = 0;
  (this->video_).crtc_.vsync_counter_ = 0;
  (this->video_).crtc_.is_in_adjustment_period_ = false;
  (this->video_).crtc_.registers_[0] = '\0';
  (this->video_).crtc_.registers_[1] = '\0';
  (this->video_).crtc_.registers_[2] = '\0';
  (this->video_).crtc_.registers_[3] = '\0';
  (this->video_).crtc_.registers_[4] = '\0';
  (this->video_).crtc_.registers_[5] = '\0';
  (this->video_).crtc_.registers_[6] = '\0';
  (this->video_).crtc_.registers_[7] = '\0';
  pVVar3 = &this->video_;
  (pVVar3->crtc_).registers_[8] = '\0';
  (pVVar3->crtc_).registers_[9] = '\0';
  (pVVar3->crtc_).registers_[10] = '\0';
  (pVVar3->crtc_).registers_[0xb] = '\0';
  (pVVar3->crtc_).registers_[0xc] = '\0';
  (pVVar3->crtc_).registers_[0xd] = '\0';
  (pVVar3->crtc_).registers_[0xe] = '\0';
  (pVVar3->crtc_).registers_[0xf] = '\0';
  *(undefined4 *)((this->video_).crtc_.registers_ + 0xf) = 0;
  (this->video_).crtc_.display_skew_mask_ = 1;
  (this->video_).crtc_.character_is_visible_shifter_ = 0;
  (this->video_).crtc_.is_cursor_line_ = false;
  (this->video_).full_clock_ = 0;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keyboard_).input_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->keyboard_).pic_ = pic;
  (this->keyboard_).reset_delay_ = 0;
  FloppyController::FloppyController(&this->fdc_,pic,&this->dma_,1);
  (this->pit_observer_).pic_ = pic;
  (this->pit_observer_).speaker_ = this_00;
  (this->ppi_handler_).high_switches_observed_ = false;
  (this->ppi_handler_).high_switches_ = '\0';
  (this->ppi_handler_).low_switches_ = '\0';
  (this->ppi_handler_).use_high_switches_ = false;
  (this->ppi_handler_).speaker_ = this_00;
  (this->ppi_handler_).keyboard_ = &this->keyboard_;
  (this->ppi_handler_).enable_keyboard_ = false;
  (this->ppi_handler_).high_switches_ = '\a';
  (this->ppi_handler_).low_switches_ = '\r';
  (this->pit_).observer_ = &this->pit_observer_;
  (this->pit_).read_back_ = false;
  lVar7 = 0x5a0;
  do {
    *(undefined8 *)((long)this + lVar7 + -0xc) = 2;
    *(undefined2 *)((long)this + lVar7 + -4) = 0;
    *(undefined1 *)((long)this + lVar7 + -2) = 1;
    *(undefined8 *)((long)&(this->super_Machine)._vptr_Machine + lVar7) = 0;
    lVar7 = lVar7 + 0x14;
  } while (lVar7 != 0x5dc);
  (this->ppi_).control_ = '\0';
  (this->ppi_).outputs_[0] = '\0';
  (this->ppi_).outputs_[1] = '\0';
  (this->ppi_).outputs_[2] = '\0';
  (this->ppi_).port_handler_ = &this->ppi_handler_;
  (this->rtc_).ram_._M_elems[0] = '\0';
  (this->rtc_).ram_._M_elems[1] = '\0';
  (this->rtc_).ram_._M_elems[2] = '\0';
  (this->rtc_).ram_._M_elems[3] = '\0';
  (this->rtc_).ram_._M_elems[4] = '\0';
  (this->rtc_).ram_._M_elems[5] = '\0';
  (this->rtc_).ram_._M_elems[6] = '\0';
  (this->rtc_).ram_._M_elems[7] = '\0';
  pRVar4 = &this->rtc_;
  (pRVar4->ram_)._M_elems[8] = '\0';
  (pRVar4->ram_)._M_elems[9] = '\0';
  (pRVar4->ram_)._M_elems[10] = '\0';
  (pRVar4->ram_)._M_elems[0xb] = '\0';
  (pRVar4->ram_)._M_elems[0xc] = '\0';
  (pRVar4->ram_)._M_elems[0xd] = '\0';
  (pRVar4->ram_)._M_elems[0xe] = '\0';
  (pRVar4->ram_)._M_elems[0xf] = '\0';
  pRVar4 = &this->rtc_;
  (pRVar4->ram_)._M_elems[0x10] = '\0';
  (pRVar4->ram_)._M_elems[0x11] = '\0';
  (pRVar4->ram_)._M_elems[0x12] = '\0';
  (pRVar4->ram_)._M_elems[0x13] = '\0';
  (pRVar4->ram_)._M_elems[0x14] = '\0';
  (pRVar4->ram_)._M_elems[0x15] = '\0';
  (pRVar4->ram_)._M_elems[0x16] = '\0';
  (pRVar4->ram_)._M_elems[0x17] = '\0';
  pRVar4 = &this->rtc_;
  (pRVar4->ram_)._M_elems[0x18] = '\0';
  (pRVar4->ram_)._M_elems[0x19] = '\0';
  (pRVar4->ram_)._M_elems[0x1a] = '\0';
  (pRVar4->ram_)._M_elems[0x1b] = '\0';
  (pRVar4->ram_)._M_elems[0x1c] = '\0';
  (pRVar4->ram_)._M_elems[0x1d] = '\0';
  (pRVar4->ram_)._M_elems[0x1e] = '\0';
  (pRVar4->ram_)._M_elems[0x1f] = '\0';
  pRVar4 = &this->rtc_;
  (pRVar4->ram_)._M_elems[0x20] = '\0';
  (pRVar4->ram_)._M_elems[0x21] = '\0';
  (pRVar4->ram_)._M_elems[0x22] = '\0';
  (pRVar4->ram_)._M_elems[0x23] = '\0';
  (pRVar4->ram_)._M_elems[0x24] = '\0';
  (pRVar4->ram_)._M_elems[0x25] = '\0';
  (pRVar4->ram_)._M_elems[0x26] = '\0';
  (pRVar4->ram_)._M_elems[0x27] = '\0';
  pRVar4 = &this->rtc_;
  (pRVar4->ram_)._M_elems[0x28] = '\0';
  (pRVar4->ram_)._M_elems[0x29] = '\0';
  (pRVar4->ram_)._M_elems[0x2a] = '\0';
  (pRVar4->ram_)._M_elems[0x2b] = '\0';
  (pRVar4->ram_)._M_elems[0x2c] = '\0';
  (pRVar4->ram_)._M_elems[0x2d] = '\0';
  (pRVar4->ram_)._M_elems[0x2e] = '\0';
  (pRVar4->ram_)._M_elems[0x2f] = '\0';
  *(undefined4 *)((this->rtc_).ram_._M_elems + 0x2f) = 0;
  (this->rtc_).statusB_ = '\x02';
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_005a6620;
  Context::Context(&this->context,&this->pit_,&this->dma_,&this->ppi_,pic,card,&this->fdc_,
                   &this->rtc_);
  (this->decoder).decoder.phase_ = Instruction;
  (this->decoder).decoder.modregrm_format_ = MemReg_Reg;
  (this->decoder).decoder.operation_ = Invalid;
  (this->decoder).decoder.consumed_ = 0;
  (this->decoder).decoder.operand_bytes_ = 0;
  (this->decoder).decoder.source_ = None;
  (this->decoder).decoder.destination_ = None;
  (this->decoder).decoder.displacement_ = 0;
  (this->decoder).decoder.operand_ = 0;
  (this->decoder).decoder.inward_data_ = 0;
  (this->decoder).decoder.next_inward_data_shift_ = 0;
  (this->decoder).decoder.sib_ = '\0';
  (this->decoder).decoder.displacement_size_ = None;
  (this->decoder).decoder.operand_size_ = None;
  (this->decoder).decoder.operation_size_ = None;
  (this->decoder).decoder.sign_extend_displacement_ = true;
  (this->decoder).decoder.sign_extend_operand_ = false;
  (this->decoder).decoder.repetition_ = None;
  (this->decoder).decoder.lock_ = false;
  (this->decoder).decoder.segment_override_ = None;
  (this->decoder).decoder.default_address_size_ = b16;
  (this->decoder).decoder.default_data_size_ = Word;
  (this->decoder).decoder.address_size_ = b16;
  (this->decoder).decoder.data_size_ = Word;
  this->decoded_ip_ = 0;
  this->speed_ = ApproximatelyOriginal;
  (this->decoded).first = 0;
  (this->decoded).second.operation_ = Invalid;
  (this->decoded).second.mem_exts_source_ = '\0';
  (this->decoded).second.source_data_dest_sib_ = 0;
  *(undefined8 *)(this->decoded).second.extensions_ = 0;
  this->speed_ = target->speed;
  pMVar1 = &(this->context).memory;
  (this->dma_).memory_ = pMVar1;
  (this->super_TimedMachine).clock_rate_ = 1193182.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>::set_input_rate
            (&(this->speaker_).speaker.
              super_LowpassBase<Outputs::Speaker::PullLowpass<Audio::Toggle>,_false>,1193182.0);
  ROM::Request::Request(&local_58,PCCompatibleGLaBIOS,false);
  ROM::Request::Request(&local_80,PCCompatibleGLaTICK,true);
  ROM::Request::operator&&((Request *)&roms,&local_58,&local_80);
  ROM::Request::Request(&local_a8,PCCompatibleMDAFont,false);
  ROM::Request::operator&&(&request,(Request *)&roms,&local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_a8.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_80.node.children);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&local_58.node.children);
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)(&roms,(_Any_data *)rom_fetcher,&request);
  bVar6 = ROM::Request::validate(&request,&roms);
  p_Var2 = roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var12->_M_header;
  p_Var5 = roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (!bVar6) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&ROMMachine::Error::typeinfo,0);
  }
  for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
      p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < 0x50]) {
    if (0x4f < (int)*(size_t *)(p_Var5 + 1)) {
      p_Var8 = p_Var5;
    }
  }
  p_Var10 = p_Var12;
  if (((_Rb_tree_header *)p_Var8 != p_Var12) &&
     (p_Var10 = (_Rb_tree_header *)p_Var8, 0x50 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count))
  {
    p_Var10 = p_Var12;
  }
  sVar11 = *(long *)((long)(p_Var10 + 1) + 8) - (long)*(void **)(p_Var10 + 1);
  p_Var8 = &p_Var12->_M_header;
  p_Var5 = p_Var2;
  if (sVar11 != 0) {
    memmove((void *)((long)pMVar1 + (0x100000 - sVar11)),*(void **)(p_Var10 + 1),sVar11);
  }
  for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
      p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < 0x51]) {
    if (0x50 < (int)*(size_t *)(p_Var5 + 1)) {
      p_Var8 = p_Var5;
    }
  }
  p_Var10 = p_Var12;
  if (((_Rb_tree_header *)p_Var8 != p_Var12) &&
     (p_Var10 = (_Rb_tree_header *)p_Var8, 0x51 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count))
  {
    p_Var10 = p_Var12;
  }
  p_Var8 = &p_Var12->_M_header;
  if (p_Var10 != p_Var12) {
    sVar11 = *(long *)((long)(p_Var10 + 1) + 8) - (long)*(void **)(p_Var10 + 1);
    if (sVar11 != 0) {
      memmove((this->context).memory.memory._M_elems + 0xd0000,*(void **)(p_Var10 + 1),sVar11);
    }
  }
  for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
      p_Var2 = (&p_Var2->_M_left)[(int)*(size_t *)(p_Var2 + 1) < 0x53]) {
    if (0x52 < (int)*(size_t *)(p_Var2 + 1)) {
      p_Var8 = p_Var2;
    }
  }
  if (((_Rb_tree_header *)p_Var8 != p_Var12) &&
     ((int)((_Rb_tree_header *)p_Var8)->_M_node_count < 0x54)) {
    p_Var12 = (_Rb_tree_header *)p_Var8;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var12 + 1));
  (this->video_).outputter_.ram = (this->context).memory.memory._M_elems + 0xb0000;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->video_).outputter_.font,&local_e8);
  if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (*(this->super_Machine)._vptr_Machine[7])(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&roms._M_t);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  return;
}

Assistant:

ConcreteMachine(
			const Analyser::Static::PCCompatible::Target &target,
			const ROMMachine::ROMFetcher &rom_fetcher
		) :
			keyboard_(pic_),
			fdc_(pic_, dma_, DriveCount),
			pit_observer_(pic_, speaker_),
			ppi_handler_(speaker_, keyboard_, video, DriveCount),
			pit_(pit_observer_),
			ppi_(ppi_handler_),
			context(pit_, dma_, ppi_, pic_, video_, fdc_, rtc_)
		{
			// Capture speed.
			speed_ = target.speed;

			// Set up DMA source/target.
			dma_.set_memory(&context.memory);

			// Use clock rate as a MIPS count; keeping it as a multiple or divisor of the PIT frequency is easy.
			static constexpr int pit_frequency = 1'193'182;
			set_clock_rate(double(pit_frequency));
			speaker_.speaker.set_input_rate(double(pit_frequency));

			// Fetch the BIOS. [8088 only, for now]
			const auto bios = ROM::Name::PCCompatibleGLaBIOS;
			const auto tick = ROM::Name::PCCompatibleGLaTICK;
			const auto font = Video::FontROM;

			ROM::Request request = ROM::Request(bios) && ROM::Request(tick, true) && ROM::Request(font);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// A BIOS is mandatory.
			const auto &bios_contents = roms.find(bios)->second;
			context.memory.install(0x10'0000 - bios_contents.size(), bios_contents.data(), bios_contents.size());

			// If found, install GlaTICK at 0xd'0000.
			auto tick_contents = roms.find(tick);
			if(tick_contents != roms.end()) {
				context.memory.install(0xd'0000, tick_contents->second.data(), tick_contents->second.size());
			}

			// Give the video card something to read from.
			const auto &font_contents = roms.find(font)->second;
			video_.set_source(context.memory.at(Video::BaseAddress), font_contents);

			// ... and insert media.
			insert_media(target.media);
		}